

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ForeachLoopStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ForeachLoopStatement,slang::ast::Expression_const&,std::span<slang::ast::ForeachLoopStatement::LoopDim,18446744073709551615ul>,slang::ast::Statement_const&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,
          span<slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> *args_1,
          Statement *args_2,SourceRange *args_3)

{
  SourceRange sourceRange;
  ForeachLoopStatement *body;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  span<slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> *in_RSI;
  undefined8 *in_R8;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
  in_stack_ffffffffffffffc8;
  
  body = (ForeachLoopStatement *)
         allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
  span<slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
            ((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> *)body,
             in_RSI);
  sourceRange.endLoc = in_RDX;
  sourceRange.startLoc = in_RCX;
  slang::ast::ForeachLoopStatement::ForeachLoopStatement
            ((ForeachLoopStatement *)in_R8[1],(Expression *)*in_R8,in_stack_ffffffffffffffc8,
             &body->super_Statement,sourceRange);
  return body;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }